

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::deinit
          (TextureCubeMapArrayColorDepthAttachmentsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) &&
     ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false)) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar2 = CONCAT44(extraout_var,iVar1);
    releaseAndDetachTextureObject(this,this->m_color_texture_id,true);
    releaseAndDetachTextureObject(this,this->m_depth_texture_id,false);
    (**(code **)(lVar2 + 0x1680))(0);
    (**(code **)(lVar2 + 0xd8))(0);
    if (this->m_fragment_shader_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_fragment_shader_id = 0;
    }
    if (this->m_framebuffer_object_id != 0) {
      (**(code **)(lVar2 + 0x440))(1,&this->m_framebuffer_object_id);
      this->m_framebuffer_object_id = 0;
    }
    if (this->m_layered_geometry_shader_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_layered_geometry_shader_id = 0;
    }
    if (this->m_layered_program_id != 0) {
      (**(code **)(lVar2 + 0x448))();
      this->m_layered_program_id = 0;
    }
    if (this->m_non_layered_geometry_shader_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_non_layered_geometry_shader_id = 0;
    }
    if (this->m_non_layered_program_id != 0) {
      (**(code **)(lVar2 + 0x448))();
      this->m_non_layered_program_id = 0;
    }
    if (this->m_vertex_shader_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_vertex_shader_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
  }
  return;
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::deinit()
{
	/* Deinitialize base class */
	TestCaseBase::deinit();

	if (true != m_is_texture_cube_map_array_supported)
	{
		return;
	}
	if (true != m_is_geometry_shader_extension_supported)
	{
		return;
	}

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release texture objects */
	releaseAndDetachTextureObject(m_color_texture_id, true /* is_color_attachment */);
	releaseAndDetachTextureObject(m_depth_texture_id, false /* is_color_attachment */);

	/* Restore default state */
	gl.useProgram(0);
	gl.bindVertexArray(0);

	/* Delete all remaining ES objects the test may have created. */
	if (0 != m_fragment_shader_id)
	{
		gl.deleteShader(m_fragment_shader_id);

		m_fragment_shader_id = 0;
	}

	if (0 != m_framebuffer_object_id)
	{
		gl.deleteFramebuffers(1, &m_framebuffer_object_id);

		m_framebuffer_object_id = 0;
	}

	if (0 != m_layered_geometry_shader_id)
	{
		gl.deleteShader(m_layered_geometry_shader_id);

		m_layered_geometry_shader_id = 0;
	}

	if (0 != m_layered_program_id)
	{
		gl.deleteProgram(m_layered_program_id);

		m_layered_program_id = 0;
	}

	if (0 != m_non_layered_geometry_shader_id)
	{
		gl.deleteShader(m_non_layered_geometry_shader_id);

		m_non_layered_geometry_shader_id = 0;
	}

	if (0 != m_non_layered_program_id)
	{
		gl.deleteProgram(m_non_layered_program_id);

		m_non_layered_program_id = 0;
	}

	if (0 != m_vertex_shader_id)
	{
		gl.deleteShader(m_vertex_shader_id);

		m_vertex_shader_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}